

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solitaire.cpp
# Opt level: O2

void __thiscall solitaire::Solitaire::tryAddCardsOnTableauPile(Solitaire *this,PileId *id)

{
  bool bVar1;
  PileId local_14;
  
  throwExceptionOnInvalidTableauPileId(this,&local_14);
  bVar1 = isGameInProgressAndHandContainsCards(this);
  if (bVar1) {
    tryAddCardOnTableauPileFromHand(this,(this->tableauPiles)._M_elems + id->t);
    return;
  }
  return;
}

Assistant:

void Solitaire::tryAddCardsOnTableauPile(const PileId id) {
    throwExceptionOnInvalidTableauPileId(id);
    if (isGameInProgressAndHandContainsCards())
        tryAddCardOnTableauPileFromHand(tableauPiles[id]);
}